

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int incrPhraseTokenNext(Fts3Table *pTab,Fts3Phrase *pPhrase,int iToken,TokenDoclist *p,u8 *pbEof)

{
  Fts3PhraseToken *pToken;
  int rc;
  u8 *pbEof_local;
  TokenDoclist *p_local;
  int iToken_local;
  Fts3Phrase *pPhrase_local;
  Fts3Table *pTab_local;
  
  pToken._4_4_ = 0;
  if (pPhrase->iDoclistToken == iToken) {
    fts3EvalDlPhraseNext(pTab,&pPhrase->doclist,pbEof);
    p->pList = (pPhrase->doclist).pList;
    p->nList = (pPhrase->doclist).nList;
    p->iDocid = (pPhrase->doclist).iDocid;
  }
  else if (pPhrase->aToken[iToken].pSegcsr == (Fts3MultiSegReader *)0x0) {
    p->bIgnore = 1;
  }
  else {
    pToken._4_4_ = sqlite3Fts3MsrIncrNext
                             (pTab,pPhrase->aToken[iToken].pSegcsr,&p->iDocid,&p->pList,&p->nList);
    if (p->pList == (char *)0x0) {
      *pbEof = '\x01';
    }
  }
  return pToken._4_4_;
}

Assistant:

static int incrPhraseTokenNext(
  Fts3Table *pTab,                /* Virtual table handle */
  Fts3Phrase *pPhrase,            /* Phrase to advance token of */
  int iToken,                     /* Specific token to advance */
  TokenDoclist *p,                /* OUT: Docid and doclist for new entry */
  u8 *pbEof                       /* OUT: True if iterator is at EOF */
){
  int rc = SQLITE_OK;

  if( pPhrase->iDoclistToken==iToken ){
    assert( p->bIgnore==0 );
    assert( pPhrase->aToken[iToken].pSegcsr==0 );
    fts3EvalDlPhraseNext(pTab, &pPhrase->doclist, pbEof);
    p->pList = pPhrase->doclist.pList;
    p->nList = pPhrase->doclist.nList;
    p->iDocid = pPhrase->doclist.iDocid;
  }else{
    Fts3PhraseToken *pToken = &pPhrase->aToken[iToken];
    assert( pToken->pDeferred==0 );
    assert( pToken->pSegcsr || pPhrase->iDoclistToken>=0 );
    if( pToken->pSegcsr ){
      assert( p->bIgnore==0 );
      rc = sqlite3Fts3MsrIncrNext(
          pTab, pToken->pSegcsr, &p->iDocid, &p->pList, &p->nList
      );
      if( p->pList==0 ) *pbEof = 1;
    }else{
      p->bIgnore = 1;
    }
  }

  return rc;
}